

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O3

void __thiscall
pzgeom::TPZArc3D::X<double>
          (TPZArc3D *this,TPZFMatrix<double> *coord,TPZVec<double> *loc,TPZVec<double> *result)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  int i;
  double dVar9;
  TPZFNMatrix<4,_double> RotMatrix;
  TPZManVector<double,_3> MappedBASE2D;
  double local_150;
  TPZFMatrix<double> local_120;
  double local_90 [5];
  TPZManVector<double,_3> local_68;
  
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_68,3,(double *)&local_120);
  local_120.fElem = local_90;
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01878f70;
  local_120.fSize = 4;
  local_120.fGiven = local_120.fElem;
  TPZVec<int>::TPZVec(&local_120.fPivot.super_TPZVec<int>,0);
  local_120.fPivot.super_TPZVec<int>.fStore = local_120.fPivot.fExtAlloc;
  local_120.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_120.fPivot.super_TPZVec<int>.fNElements = 0;
  local_120.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_120.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_120.fWork.fStore = (double *)0x0;
  local_120.fWork.fNElements = 0;
  local_120.fWork.fNAlloc = 0;
  local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01878c80;
  dVar9 = this->fRadius;
  dVar9 = ((*loc->fStore + 1.0) * this->fAngle * dVar9) / (dVar9 + dVar9);
  dVar1 = cos(dVar9);
  if ((local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *local_120.fElem = dVar1;
  dVar1 = sin(dVar9);
  if ((local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
     (local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_120.fElem[local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow] = dVar1;
  dVar1 = sin(dVar9);
  if ((local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
     (local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_120.fElem[1] = -dVar1;
  dVar9 = cos(dVar9);
  if ((1 < local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (1 < local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    local_120.fElem[local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 1] = dVar9;
    bVar5 = true;
    lVar4 = 0;
    do {
      local_150 = 0.0;
      lVar7 = 0;
      bVar2 = true;
      do {
        bVar8 = bVar2;
        if ((local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4) ||
           (local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar7)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_150 = local_150 +
                    local_120.fElem
                    [local_120.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar7 + lVar4] *
                    (this->finitialVector).super_TPZVec<double>.fStore[lVar7];
        lVar7 = 1;
        bVar2 = false;
      } while (bVar8);
      local_68.super_TPZVec<double>.fStore[lVar4] =
           local_150 +
           (double)((uint)lVar4 ^ 1) * this->fXcenter + (double)(uint)lVar4 * this->fYcenter;
      lVar4 = 1;
      bVar2 = !bVar5;
      bVar5 = false;
      if (bVar2) {
        local_68.super_TPZVec<double>.fStore[2] = 0.0;
        lVar4 = 0;
        lVar7 = 0;
        while( true ) {
          pdVar3 = (double *)((long)(this->fIBaseCn).super_TPZFMatrix<double>.fElem + lVar4);
          dVar9 = 0.0;
          lVar6 = 0;
          do {
            dVar9 = dVar9 + *pdVar3 * local_68.super_TPZVec<double>.fStore[lVar6];
            lVar6 = lVar6 + 1;
            pdVar3 = pdVar3 + (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                              super_TPZBaseMatrix.fRow;
          } while (lVar6 != 3);
          lVar6 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          if ((lVar6 <= lVar7) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3))
          break;
          result->fStore[lVar7] = dVar9 + coord->fElem[lVar6 * 2 + lVar7];
          lVar7 = lVar7 + 1;
          lVar4 = lVar4 + 8;
          if (lVar7 == 3) {
            TPZFMatrix<double>::~TPZFMatrix(&local_120,&PTR_PTR_01878f38);
            TPZManVector<double,_3>::~TPZManVector(&local_68);
            return;
          }
        }
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
    } while( true );
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            /** Computing initialVector = (iniR2 - CenterR2) */
            TPZManVector<T,3> MappedBASE2D(3,0.);
            
            TPZFNMatrix<4,T> RotMatrix(2,2);
            T deflection = fAngle * fRadius * (loc[0] + 1.) / (2.*fRadius);
            RotMatrix(0,0) =  cos(deflection); RotMatrix(0,1) = sin(deflection);
            RotMatrix(1,0) = -sin(deflection); RotMatrix(1,1) = cos(deflection);
            
            /** MappedPoint_R2 = centerCoord + vectorRotated , where Vx = RotationMatrix . Va */
            T centerCoord, vectRotated = 0.;
            for(int i = 0; i < 2; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 2; j++) vectRotated += RotMatrix(i,j)*finitialVector[j];
                centerCoord = (1-i)*fXcenter + i*fYcenter;
                MappedBASE2D[i] = centerCoord + vectRotated;
            }
            
            /** Changing Basis of Obtained MappedPoint from R2 to R3 */
            MappedBASE2D[2] = 0.;
            for(int i = 0; i < 3; i++)
            {
                vectRotated = 0.;
                for(int j = 0; j < 3; j++)
                {
                    vectRotated += fIBaseCn.GetVal(i,j)*MappedBASE2D[j];
                }
                result[i] = vectRotated + coord(i,2);
            }

        }